

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
CppGenerator::addProductToLoop
          (CppGenerator *this,ProductAggregate *prodAgg,size_t *currentLoop,bool *loopsOverRelation,
          size_t *maxDepth)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  reference this_00;
  mapped_type *pmVar4;
  size_type sVar5;
  pointer ppVar6;
  reference this_01;
  mapped_type *pmVar7;
  reference pvVar8;
  reference pvVar9;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar10;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *this_02;
  pointer ppVar11;
  reference pvVar12;
  mapped_type *pmVar13;
  reference this_03;
  _Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true> this_04;
  unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
  *this_05;
  value_type *__x;
  size_t *in_RCX;
  ProductAggregate *in_RDX;
  CppGenerator *in_RSI;
  long in_RDI;
  bool *in_R8;
  pair<unsigned_long,_unsigned_long> pVar14;
  size_t newID_1;
  iterator regit;
  ProductAggregate *prevProdAgg;
  AggRegTuple regTuple;
  size_t newID;
  iterator regit_1;
  AggRegTuple postRegTuple;
  pair<unsigned_long,_unsigned_long> postComputation;
  size_t nextLoop;
  size_t next;
  pair<unsigned_long,_unsigned_long> *viewAgg_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range4_1;
  size_t viewID_1;
  size_t nextID_1;
  iterator viewit;
  pair<unsigned_long,_unsigned_long> *viewAgg;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range4;
  size_t viewID;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  viewReg;
  pair<unsigned_long,_unsigned_long> regTupleView;
  bool singleViewAgg;
  bool newViewProduct;
  size_t nextID;
  iterator proditerator;
  prod_bitset loopFunctions;
  pair<bool,_unsigned_long> regTupleProduct;
  dyn_bitset viewsForThisLoop;
  dyn_bitset *thisLoop;
  size_t thisLoopID;
  pair<unsigned_long,_unsigned_long> previousComputation;
  key_type *in_stack_fffffffffffff958;
  AggRegTuple *in_stack_fffffffffffff960;
  value_type *in_stack_fffffffffffff968;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff970;
  size_type in_stack_fffffffffffff990;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff998;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff9a0;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  pair<unsigned_long,_unsigned_long> local_5a8;
  unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
  *local_598;
  pair<unsigned_long,_unsigned_long> local_590;
  _Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true> local_580;
  _Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true> local_578;
  reference local_570;
  int local_564;
  size_type local_560;
  pair<unsigned_long,_unsigned_long> local_558;
  pair<unsigned_long,_unsigned_long> local_548;
  pair<bool,_unsigned_long> local_538 [2];
  pair<unsigned_long,_unsigned_long> local_518;
  pointer local_500;
  byte local_4f8;
  byte local_4f7;
  pair<unsigned_long,_unsigned_long> local_4f0;
  undefined1 local_4e0;
  pair<unsigned_long,_unsigned_long> local_4d8;
  size_type local_4c8;
  pair<unsigned_long,_unsigned_long> local_4c0;
  _Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true> local_4b0;
  _Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true> local_4a8;
  pair<unsigned_long,_unsigned_long> local_4a0 [3];
  pair<unsigned_long,_unsigned_long> local_470;
  undefined1 local_460;
  pair<unsigned_long,_unsigned_long> local_370 [15];
  size_type local_280;
  ulong local_278;
  int local_26c;
  size_type local_268;
  reference local_260;
  pair<unsigned_long,_unsigned_long> *local_258;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **local_248;
  size_type local_240;
  pair<unsigned_long,_unsigned_long> local_238;
  size_type local_228;
  pair<unsigned_long,_unsigned_long> local_220;
  _Self local_210;
  _Self local_208;
  reference local_200;
  pair<unsigned_long,_unsigned_long> *local_1f8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **local_1e8;
  size_type local_1e0;
  int local_1c0 [2];
  pair<unsigned_long,_unsigned_long> local_1b8;
  byte local_1a3;
  byte local_1a2;
  bool local_1a1;
  pair<bool,_unsigned_long> local_1a0;
  size_type local_190;
  bool local_181;
  pair<bool,_unsigned_long> local_180;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false> local_170;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false> local_168 [25];
  int local_a0;
  bool local_99;
  pair<bool,_unsigned_long> local_98 [2];
  reference local_78 [3];
  reference local_48;
  size_t *maxDepth_00;
  ProductAggregate *pPVar15;
  pair<unsigned_long,_unsigned_long> local_10;
  
  maxDepth_00 = (size_t *)(in_RDX->product).super__Base_bitset<24UL>._M_w[0];
  local_48 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x550),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x598),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffff960,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffff958);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b87a1);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b87a9);
  local_78[0] = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968);
  bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)local_78);
  *(bool *)in_RCX = bVar2;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b8835);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b883d);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968);
  local_99 = false;
  local_a0 = 0;
  std::pair<bool,_unsigned_long>::pair<bool,_int,_true>(local_98,&local_99,&local_a0);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)(in_RDI + 0x568),
             (in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
  std::operator&((bitset<1500UL> *)in_stack_fffffffffffff970,
                 (bitset<1500UL> *)in_stack_fffffffffffff968);
  bVar2 = std::bitset<1500UL>::any((bitset<1500UL> *)0x2b88e4);
  if (bVar2) {
    std::
    vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
    ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                  *)(in_RDI + 0x388),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
    local_168[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
         ::find((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffff958,(key_type *)0x2b891c);
    std::
    vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
    ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                  *)(in_RDI + 0x388),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
    local_170._M_cur =
         (__node_type *)
         std::
         unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
         ::end((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                *)in_stack_fffffffffffff958);
    bVar2 = std::__detail::operator!=(local_168,&local_170);
    if (bVar2) {
      local_181 = true;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false,_false>
                           *)0x2b8995);
      std::pair<bool,_unsigned_long>::pair<bool,_unsigned_long_&,_true>
                (&local_180,&local_181,&ppVar3->second);
      std::pair<bool,_unsigned_long>::operator=(local_98,&local_180);
    }
    else {
      this_00 = std::
                vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                ::operator[]((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                              *)(in_RDI + 0x3a0),(in_RDX->product).super__Base_bitset<24UL>._M_w[0])
      ;
      sVar5 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size(this_00)
      ;
      local_190 = sVar5;
      std::
      vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x388),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
      pmVar4 = std::
               unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
               ::operator[]((unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
      *pmVar4 = sVar5;
      local_1a1 = true;
      std::pair<bool,_unsigned_long>::pair<bool,_unsigned_long_&,_true>
                (&local_1a0,&local_1a1,&local_190);
      std::pair<bool,_unsigned_long>::operator=(local_98,&local_1a0);
      std::
      vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
      ::operator[]((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                    *)(in_RDI + 0x3a0),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 in_stack_fffffffffffff970,(value_type *)in_stack_fffffffffffff968);
    }
  }
  local_1a2 = 0;
  local_1a3 = 0;
  local_1c0[1] = 0x7fffffff;
  local_1c0[0] = 0x7fffffff;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_1b8,local_1c0 + 1,local_1c0);
  bVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff970);
  if (!bVar2) {
    sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                      (in_stack_fffffffffffff970);
    if (sVar5 < 2) {
      sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                        (in_stack_fffffffffffff970);
      if (sVar5 == 1) {
        local_1a3 = 1;
        local_240 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               0x2b8ee6);
        local_248 = &in_RSI->groupIncomingViews;
        local_250._M_current =
             (pair<unsigned_long,_unsigned_long> *)
             std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffff958);
        local_258 = (pair<unsigned_long,_unsigned_long> *)
                    std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           *)in_stack_fffffffffffff958);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff960,
                             (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff958);
          if (!bVar2) break;
          local_260 = __gnu_cxx::
                      __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      ::operator*(&local_250);
          if (local_260->first == local_240) {
            std::pair<unsigned_long,_unsigned_long>::operator=(&local_1b8,local_260);
            break;
          }
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator++(&local_250);
        }
      }
    }
    else {
      local_1a2 = 1;
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)0x2b8b72);
      local_1e0 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             0x2b8b7f);
      while (local_1e0 != 0xffffffffffffffff) {
        local_1e8 = &in_RSI->groupIncomingViews;
        local_1f0._M_current =
             (pair<unsigned_long,_unsigned_long> *)
             std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffff958);
        local_1f8 = (pair<unsigned_long,_unsigned_long> *)
                    std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           *)in_stack_fffffffffffff958);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff960,
                             (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff958);
          if (!bVar2) break;
          local_200 = __gnu_cxx::
                      __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      ::operator*(&local_1f0);
          if (local_200->first == local_1e0) {
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)in_stack_fffffffffffff970,&in_stack_fffffffffffff968->previous);
            break;
          }
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator++(&local_1f0);
        }
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(in_RDI + 0x598),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
        local_1e0 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                              (in_stack_fffffffffffff998,in_stack_fffffffffffff990);
      }
      std::
      vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x3d8),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
      local_208._M_node =
           (_Base_ptr)
           std::
           map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
           ::find((map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff958,(key_type *)0x2b8cfd);
      std::
      vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x3d8),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
      local_210._M_node =
           (_Base_ptr)
           std::
           map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
           ::end((map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffff958);
      bVar2 = std::operator!=(&local_208,&local_210);
      if (bVar2) {
        pPVar15 = in_RDX;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>
                               *)0x2b8d7e);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                  (&local_220,(unsigned_long *)in_RDX,&ppVar6->second);
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_1b8,&local_220);
      }
      else {
        this_01 = std::
                  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                                *)(in_RDI + 0x3f0),
                               (in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
        sVar5 = std::
                vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                ::size(this_01);
        local_228 = sVar5;
        std::
        vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x3d8),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
        pmVar7 = std::
                 map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                 ::operator[]((map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                               *)in_stack_fffffffffffff9a0,(key_type *)in_stack_fffffffffffff998);
        *pmVar7 = sVar5;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                  (&local_238,(unsigned_long *)in_RDX,&local_228);
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_1b8,&local_238);
        std::
        vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
        ::operator[]((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                      *)(in_RDI + 0x3f0),(in_RDX->product).super__Base_bitset<24UL>._M_w[0]);
        std::
        vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
        ::push_back((vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                     *)in_stack_fffffffffffff970,(value_type *)in_stack_fffffffffffff968);
        pPVar15 = in_RDX;
      }
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffff970);
      in_RDX = pPVar15;
    }
  }
  local_268 = std::
              vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(in_RDI + 0x550));
  local_26c = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
            (&local_10,&local_268,&local_26c);
  local_278 = 0;
  while( true ) {
    uVar1 = local_278;
    pvVar8 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x5b0),(size_type)maxDepth_00);
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
    if (sVar5 <= uVar1) {
      AggRegTuple::AggRegTuple(in_stack_fffffffffffff960);
      std::pair<bool,_unsigned_long>::operator=(local_538,local_98);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_4f0,&local_1b8);
      local_4f8 = local_1a2 & 1;
      local_4f7 = local_1a3 & 1;
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_518,&local_10);
      local_560 = std::
                  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)(in_RDI + 0x550));
      local_564 = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                (&local_558,&local_560,&local_564);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_548,&local_558);
      local_4e0 = 0;
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b9595);
      if (bVar2) {
        if ((in_RSI->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_finish < *(pointer *)in_R8) {
          this_03 = std::
                    vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                    ::operator[]((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                                  *)(in_RDI + 0x370),
                                 (size_type)
                                 (in_RSI->groupVariableOrderBitset).
                                 super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
          local_570 = std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::operator[]
                                (this_03,(size_type)
                                         (in_RSI->groupVariableOrderBitset).
                                         super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::pair<unsigned_long,_unsigned_long>::operator=
                    (&local_548,&local_570->correspondingLoopAgg);
          local_500 = (in_RSI->groupVariableOrderBitset).
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        }
        if (((*in_RCX & 1) == 0) &&
           (((ulong)(in_RSI->viewGroups).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish & 1) != 0)) {
          local_4e0 = 1;
        }
      }
      std::
      vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x308),(size_type)maxDepth_00);
      this_04._M_cur =
           (__node_type *)
           std::
           unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
           ::find((unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff958,(key_type *)0x2b968f);
      local_578._M_cur = this_04._M_cur;
      std::
      vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
      ::operator[]((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                    *)(in_RDI + 0x308),(size_type)maxDepth_00);
      local_580._M_cur =
           (__node_type *)
           std::
           unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
           ::end((unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                  *)in_stack_fffffffffffff958);
      bVar2 = std::__detail::operator!=(&local_578,&local_580);
      if (bVar2) {
        ppVar11 = std::__detail::
                  _Node_iterator<std::pair<const_AggRegTuple,_unsigned_long>,_false,_true>::
                  operator->((_Node_iterator<std::pair<const_AggRegTuple,_unsigned_long>,_false,_true>
                              *)0x2b96f7);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_590,(unsigned_long *)&stack0xffffffffffffffc0,&ppVar11->second);
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,&local_590);
      }
      else {
        pvVar12 = std::
                  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                *)(in_RDI + 0x2f0),(size_type)maxDepth_00);
        this_05 = (unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                   *)std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar12);
        local_598 = this_05;
        std::
        vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x308),(size_type)maxDepth_00);
        __x = (value_type *)
              std::
              unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
              ::operator[](this_05,in_stack_fffffffffffff958);
        (__x->previous).first = (unsigned_long)this_05;
        std::
        vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
        ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      *)(in_RDI + 0x2f0),(size_type)maxDepth_00);
        std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::push_back
                  ((vector<AggRegTuple,_std::allocator<AggRegTuple>_> *)this_04._M_cur,__x);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_5a8,(unsigned_long *)&stack0xffffffffffffffc0,(unsigned_long *)&local_598)
        ;
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,&local_5a8);
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b9817);
      return local_10;
    }
    pvVar8 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x5b0),(size_type)maxDepth_00);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar8,local_278);
    local_280 = *pvVar9;
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x550),local_280);
    boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a0);
    bVar2 = boost::operator!=((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffff960,
                              (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffff958);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b90d8);
    if (bVar2) break;
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
              ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
               (in_RDI + 0x580),local_280);
    std::operator&((bitset<1500UL> *)in_stack_fffffffffffff970,
                   (bitset<1500UL> *)in_stack_fffffffffffff968);
    bVar2 = std::bitset<1500UL>::any((bitset<1500UL> *)0x2b9168);
    if (bVar2) {
      pVar14 = addProductToLoop(in_RSI,in_RDX,in_RCX,in_R8,maxDepth_00);
      in_stack_fffffffffffff9a0 =
           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(local_278 + 1);
      local_370[0] = pVar14;
      pvVar8 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 0x5b0),(size_type)maxDepth_00);
      pdVar10 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
      in_stack_fffffffffffff9af = false;
      if (in_stack_fffffffffffff9a0 != pdVar10) {
        this_02 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                  (in_RDI + 0x580);
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)(in_RDI + 0x5b0),(size_type)maxDepth_00);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,local_278 + 1);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                  (this_02,*pvVar9);
        std::operator&((bitset<1500UL> *)in_stack_fffffffffffff970,
                       (bitset<1500UL> *)in_stack_fffffffffffff968);
        in_stack_fffffffffffff9af = std::bitset<1500UL>::any((bitset<1500UL> *)0x2b927c);
      }
      if ((bool)in_stack_fffffffffffff9af == false) {
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,local_370);
      }
      else {
        AggRegTuple::AggRegTuple(in_stack_fffffffffffff960);
        local_460 = 1;
        std::pair<unsigned_long,_unsigned_long>::operator=(local_4a0,&local_10);
        std::pair<unsigned_long,_unsigned_long>::operator=(&local_470,local_370);
        std::
        vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x308),local_280);
        local_4a8._M_cur =
             (__node_type *)
             std::
             unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
             ::find((unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff958,(key_type *)0x2b92fe);
        std::
        vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
        ::operator[]((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                      *)(in_RDI + 0x308),local_280);
        local_4b0._M_cur =
             (__node_type *)
             std::
             unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
             ::end((unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff958);
        bVar2 = std::__detail::operator!=(&local_4a8,&local_4b0);
        if (bVar2) {
          ppVar11 = std::__detail::
                    _Node_iterator<std::pair<const_AggRegTuple,_unsigned_long>,_false,_true>::
                    operator->((_Node_iterator<std::pair<const_AggRegTuple,_unsigned_long>,_false,_true>
                                *)0x2b9366);
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                    (&local_4c0,&local_280,&ppVar11->second);
          std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,&local_4c0);
        }
        else {
          pvVar12 = std::
                    vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                    ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                                  *)(in_RDI + 0x2f0),local_280);
          sVar5 = std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::size(pvVar12);
          local_4c8 = sVar5;
          std::
          vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
          ::operator[]((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                        *)(in_RDI + 0x308),local_280);
          pmVar13 = std::
                    unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                    ::operator[]((unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>
                                  *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
          *pmVar13 = sVar5;
          std::
          vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
          ::operator[]((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                        *)(in_RDI + 0x2f0),local_280);
          std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::push_back
                    ((vector<AggRegTuple,_std::allocator<AggRegTuple>_> *)in_stack_fffffffffffff970,
                     in_stack_fffffffffffff968);
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                    (&local_4d8,&local_280,&local_4c8);
          std::pair<unsigned_long,_unsigned_long>::operator=(&local_10,&local_4d8);
        }
      }
    }
    local_278 = local_278 + 1;
  }
  std::operator<<((ostream *)&std::cerr,"There is a problem with nextLoopsPerLoop\n");
  exit(1);
}

Assistant:

std::pair<size_t,size_t> CppGenerator::addProductToLoop(
    ProductAggregate& prodAgg, size_t& currentLoop, bool& loopsOverRelation,
    const size_t& maxDepth)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[currentLoop];

    dyn_bitset viewsForThisLoop = viewsPerLoop[currentLoop];
    loopsOverRelation = viewsForThisLoop[_qc->numberOfViews()];
    
    viewsForThisLoop.reset(_qc->numberOfViews());
 
    std::pair<bool,size_t> regTupleProduct = {false,0};  

    // check if this product requires computation over this loop loopmask
    prod_bitset loopFunctions = prodAgg.product & functionsPerLoop[currentLoop];
    if (loopFunctions.any())
    {
        // This should be add to the loop not depth 
        auto proditerator = localProductMap[currentLoop].find(loopFunctions);
        if (proditerator != localProductMap[currentLoop].end())
        {
            // set this local product to the id given by the map
            regTupleProduct = {true, proditerator->second};
        }
        else
        {
            size_t nextID = localProductList[currentLoop].size();
            localProductMap[currentLoop][loopFunctions] = nextID;
            regTupleProduct = {true, nextID};
            localProductList[currentLoop].push_back(loopFunctions);
        }
    }

    bool newViewProduct = false;
    bool singleViewAgg = false;
    
    std::pair<size_t, size_t> regTupleView = {2147483647,2147483647};

    if (!prodAgg.viewAggregate.empty())
    {
        if (viewsForThisLoop.count() > 1)
        {
            newViewProduct = true;
       
            std::vector<std::pair<size_t, size_t>> viewReg;

            size_t viewID = viewsForThisLoop.find_first();
            while (viewID != boost::dynamic_bitset<>::npos)
            {
                for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
                {
                    if (viewAgg.first == viewID)
                    {
                        viewReg.push_back(viewAgg);
                        break;
                    }
                }

                viewID = viewsPerLoop[currentLoop].find_next(viewID);
            }
            auto viewit = viewProductMap[currentLoop].find(viewReg);
            if (viewit != viewProductMap[currentLoop].end())
            {
                // set this local product to the id given by the map
                regTupleView = {currentLoop, viewit->second};            
            }
            else
            {
                size_t nextID =  viewProductList[currentLoop].size();
                viewProductMap[currentLoop][viewReg] = nextID;
                regTupleView = {currentLoop, nextID};
                viewProductList[currentLoop].push_back(viewReg);
            }
        }
        else if (viewsForThisLoop.count() == 1)
        {
            // Inside a loop there would only be a single view agg, so we could avoid
            // explicitly materializing the view Agg and simply multiply directly with
            // the aggregate from the view - this could be captured in the aggregate
            // computation that captures both the local aggregate and the view Agg
            singleViewAgg = true;
        
            // reuse the simple aggregate from the corresponding view
            size_t viewID = viewsForThisLoop.find_first();

            for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
            {
                if (viewAgg.first == viewID)
                {
                    regTupleView = viewAgg;
                    break;
                }
            }

            /*************** PRINT OUT **************/
            // if (regTupleView.first == 2)
            // {
            //     std::cout << "################## " <<
            //         regTupleView.first << "  " << regTupleView.second << std::endl;
            // }
            /*************** PRINT OUT **************/

        }
    }
    
    
    std::pair<size_t,size_t> previousComputation = {listOfLoops.size(),0};
    
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) != thisLoop))
        {
            ERROR("There is a problem with nextLoopsPerLoop\n");
            exit(1);
        }
        
        if ((functionsPerLoopBranch[nextLoop] & prodAgg.product).any())
        {
            std::pair<size_t, size_t> postComputation =
                addProductToLoop(prodAgg, nextLoop, loopsOverRelation, maxDepth);
            
            if (next + 1 != nextLoopsPerLoop[thisLoopID].size() &&
                (functionsPerLoopBranch[nextLoopsPerLoop[thisLoopID][next+1]]&
                 prodAgg.product).any())
            {
                // Add this product to this loop with the 'prev'Computation
                AggRegTuple postRegTuple;
                postRegTuple.postLoopAgg = true;
                postRegTuple.previous = previousComputation; 
                postRegTuple.postLoop = postComputation;
                
                // TODO: add the aggregate to the register!!
                auto regit = aggregateRegisterMap[nextLoop].find(postRegTuple);
                if (regit != aggregateRegisterMap[nextLoop].end())
                {
                    previousComputation = {nextLoop,regit->second};
                }
                else
                {
                    // If so, add it to the aggregate register
                    size_t newID = newAggregateRegister[nextLoop].size();
                    aggregateRegisterMap[nextLoop][postRegTuple] = newID;
                    newAggregateRegister[nextLoop].push_back(postRegTuple);
                    
                    previousComputation =  {nextLoop,newID};
                }
            }
            else
            {
                previousComputation = postComputation;
            }
            
        }
    }
    
    // while(currentLoop < listOfLoops.size()-1)
    // {
    //     currentLoop++;
    //     if (((listOfLoops[currentLoop] & thisLoop) == thisLoop))
    //     {
    //         if ((functionsPerLoopBranch[currentLoop] & prodAgg.product).any())
    //         {
    //             std::pair<size_t, size_t> postComputation =
    //                 addProductToLoop(prodAgg,currentLoop,loopsOverRelation,maxDepth);
    //             /**************** PRINT OUT ******************/
    //             // std::cout << "HERE \n";
    //             // std::cout << listOfLoops[currentLoop] <<"  "<<thisLoop<<std::endl;
    //             /**************** PRINT OUT ******************/
    //             // Add this product to this loop with the 'prev'Computation
    //             AggRegTuple postRegTuple;
    //             postRegTuple.postLoopAgg = true;
    //             postRegTuple.localAgg = previousComputation; // TODO:TODO:TODO:
    //             postRegTuple.postLoop = postComputation;
    //             // TODO: add the aggregate to the register!!
    //             auto regit = aggregateRegisterMap[currentLoop].find(postRegTuple);
    //             if (regit != aggregateRegisterMap[currentLoop].end())
    //                 previousComputation = {currentLoop,regit->second};
    //             else
    //             {
    //                 // If so, add it to the aggregate register
    //                 size_t newID = newAggregateRegister[currentLoop].size();
    //                 aggregateRegisterMap[currentLoop][postRegTuple] = newID;
    //                 newAggregateRegister[currentLoop].push_back(postRegTuple); 
    //                 previousComputation =  {currentLoop,newID};;
    //             }
    //         }
    //     }
    //     else break;
    // }

    // Check if this product has already been computed, if not we add it to the list
    AggRegTuple regTuple;
    regTuple.product = regTupleProduct;
    regTuple.viewAgg = regTupleView;

    /********* PRINT OUT ********/
    // if (regTupleView.first == 2)
    // {
    //     std::cout << "###########/>>>>>>>>> " <<
    //         regTuple.viewAgg.first << "  " << regTuple.viewAgg.second << std::endl;
    // }
    /********* PRINT OUT ********/
           
    regTuple.newViewProduct = newViewProduct;
    regTuple.singleViewAgg = singleViewAgg;
    regTuple.postLoop = previousComputation;

    regTuple.previous = {listOfLoops.size(),0};
    regTuple.multiplyByCount = false;
    
    // Multiply by previous #computation -- if needed
    if (thisLoop.none())
    {
        if (prodAgg.previous.first < maxDepth)
        {            
            const ProductAggregate& prevProdAgg =
                productToVariableRegister[prodAgg.previous.first]
                [prodAgg.previous.second];
            regTuple.previous = prevProdAgg.correspondingLoopAgg;
            regTuple.prevDepth = prodAgg.previous.first;
        }
        // Mutliply by count if needed
        if (!loopsOverRelation && prodAgg.multiplyByCount)
            regTuple.multiplyByCount = true;
    }

    auto regit = aggregateRegisterMap[thisLoopID].find(regTuple);
    if (regit != aggregateRegisterMap[thisLoopID].end())
    {
        previousComputation = {thisLoopID,regit->second};
    }
    else
    {
        // If so, add it to the aggregate register
        size_t newID = newAggregateRegister[thisLoopID].size();
        aggregateRegisterMap[thisLoopID][regTuple] = newID;
        newAggregateRegister[thisLoopID].push_back(regTuple);
        
        previousComputation =  {thisLoopID,newID};
    }

    return previousComputation;
}